

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O1

void __thiscall
vkt::texture::util::TextureRenderer::TextureRenderer
          (TextureRenderer *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderWidth,deUint32 renderHeight)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *__s;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar5;
  VkCommandPool obj;
  VkImage VVar6;
  Allocation *pAVar7;
  deUint64 dVar8;
  VkImageView VVar9;
  VkRenderPass obj_00;
  VkBuffer VVar10;
  undefined8 *puVar11;
  VkFramebuffer obj_01;
  VkDescriptorPool obj_02;
  VkFence obj_03;
  undefined8 uVar12;
  VkDevice pVVar13;
  VkAllocationCallbacks *pVVar14;
  int iVar15;
  VkResult VVar16;
  TextureFormat TVar17;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar18;
  InstanceInterface *pIVar19;
  VkPhysicalDevice pVVar20;
  NotSupportedError *pNVar21;
  bool bVar22;
  deUint32 queueFamilyIndex;
  VkImageFormatProperties properties;
  VkSubpassDescription subpassDesc;
  VkImageView attachments [2];
  VkAttachmentReference *local_138;
  VkAllocationCallbacks *pVStack_130;
  VkImageCreateInfo imageCreateInfo;
  Move<vk::Handle<(vk::HandleType)17>_> local_68;
  Allocator *local_48;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  
  this->m_context = context;
  this->m_log = context->m_testCtx->m_log;
  this->m_renderWidth = renderWidth;
  this->m_renderHeight = renderHeight;
  this->m_sampleCount = sampleCount;
  this->m_multisampling = (uint)(sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar17 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  this->m_textureFormat = TVar17;
  pMVar1 = &this->m_image;
  pMVar2 = &this->m_resolvedImage;
  __s = &this->m_resolvedImageView;
  pMVar3 = &this->m_uniformBuffer;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImageMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  memset(__s,0,200);
  this->m_uniformBufferSize = 0x30;
  pMVar4 = &this->m_vertexIndexBuffer;
  pMVar5 = &this->m_resultBuffer;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
       = 0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_vertexIndexBufferMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resultBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  iVar15 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(renderHeight * renderWidth * iVar15);
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_viewportOffsetX = 0.0;
  this->m_viewportOffsetY = 0.0;
  this->m_viewportWidth = (float)renderWidth;
  this->m_viewportHeight = (float)renderHeight;
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  pAVar18 = Context::getDefaultAllocator(this->m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
  imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
  imageCreateInfo.format = subpassDesc.colorAttachmentCount;
  imageCreateInfo.extent.width = subpassDesc._28_4_;
  imageCreateInfo.sType = subpassDesc.flags;
  imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
  imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
  imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.colorAttachmentCount = 0;
  subpassDesc._28_4_ = 0;
  obj.m_internal =
       (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj);
  }
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       imageCreateInfo._0_8_;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)
         CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
  if (subpassDesc._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc.inputAttachmentCount,
               (VkCommandPool)subpassDesc._0_8_);
  }
  pIVar19 = Context::getInstanceInterface(this->m_context);
  pVVar20 = Context::getPhysicalDevice(this->m_context);
  iVar15 = (*pIVar19->_vptr_InstanceInterface[4])
                     (pIVar19,pVVar20,(ulong)this->m_imageFormat,1,0,0x13,0,&properties);
  if (iVar15 == -0xb) {
    pNVar21 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar21,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1bf);
  }
  else {
    imageCreateInfo.samples = this->m_sampleCount;
    if ((imageCreateInfo.samples & ~properties.sampleCounts) == 0) {
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.imageType = VK_IMAGE_TYPE_2D;
      imageCreateInfo.format = this->m_imageFormat;
      imageCreateInfo.extent.width = this->m_renderWidth;
      imageCreateInfo.extent.height = this->m_renderHeight;
      imageCreateInfo.extent.depth = 1;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo.arrayLayers = 1;
      imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
      imageCreateInfo.usage = 0x13;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      imageCreateInfo.queueFamilyIndexCount = 1;
      imageCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
      imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                        &imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = local_138;
      subpassDesc._24_8_ = pVStack_130;
      subpassDesc.flags = (undefined4)attachments[0].m_internal;
      subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
      subpassDesc._8_8_ = attachments[1].m_internal;
      attachments[0].m_internal = 0;
      attachments[1].m_internal = 0;
      VVar6.m_internal =
           (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
      if (VVar6.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                   VVar6);
      }
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)subpassDesc._8_8_;
      if (attachments[0].m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                   (VkImage)attachments[0].m_internal);
      }
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal);
      (*pAVar18->_vptr_Allocator[3])(attachments,pAVar18,&subpassDesc,0);
      VVar9 = attachments[0];
      attachments[0].m_internal = 0;
      pAVar7 = (this->m_imageMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar7 != (Allocation *)VVar9.m_internal) {
        if (pAVar7 != (Allocation *)0x0) {
          (*pAVar7->_vptr_Allocation[1])();
          (this->m_imageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)VVar9.m_internal;
      }
      if (attachments[0].m_internal != 0) {
        (**(code **)(*(long *)attachments[0].m_internal + 8))();
        attachments[0].m_internal = 0;
      }
      VVar16 = (*vk->_vptr_DeviceInterface[0xd])
                         (vk,device,
                          (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                          object.m_internal,
                          (((this->m_imageMemory).
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.ptr)->m_memory).m_internal);
      ::vk::checkResult(VVar16,
                        "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x1dd);
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      dVar8 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      ;
      imageCreateInfo.format = (VkFormat)dVar8;
      imageCreateInfo.extent.width = (deUint32)(dVar8 >> 0x20);
      imageCreateInfo.extent.height = 1;
      imageCreateInfo.extent.depth = this->m_imageFormat;
      imageCreateInfo.mipLevels = 3;
      imageCreateInfo.arrayLayers = 4;
      imageCreateInfo.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
      imageCreateInfo.tiling = 6;
      imageCreateInfo.usage = 1;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      imageCreateInfo.queueFamilyIndexCount = 1;
      imageCreateInfo._68_4_ = 0;
      imageCreateInfo.pQueueFamilyIndices =
           (deUint32 *)CONCAT44(imageCreateInfo.pQueueFamilyIndices._4_4_,1);
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                 (VkImageViewCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar9.m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      if (VVar9.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                    deleter,VVar9);
      }
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                   (VkImageView)properties.maxExtent._0_8_);
      }
      if (this->m_multisampling != 0) {
        local_48 = pAVar18;
        pIVar19 = Context::getInstanceInterface(this->m_context);
        pVVar20 = Context::getPhysicalDevice(this->m_context);
        iVar15 = (*pIVar19->_vptr_InstanceInterface[4])
                           (pIVar19,pVVar20,(ulong)this->m_imageFormat,1,0,0x13,0,&properties);
        if (iVar15 == -0xb) {
          pNVar21 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar21,"Format not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x206);
          __cxa_throw(pNVar21,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        imageCreateInfo.pNext._0_4_ = 0;
        imageCreateInfo.pNext._4_4_ = 0;
        imageCreateInfo.flags = 0;
        imageCreateInfo.imageType = VK_IMAGE_TYPE_2D;
        imageCreateInfo.format = this->m_imageFormat;
        imageCreateInfo.extent.width = this->m_renderWidth;
        imageCreateInfo.extent.height = this->m_renderHeight;
        imageCreateInfo.extent.depth = 1;
        imageCreateInfo.mipLevels = 1;
        imageCreateInfo.arrayLayers = 1;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = 0x13;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.queueFamilyIndexCount = 1;
        imageCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                          &imageCreateInfo,(VkAllocationCallbacks *)0x0);
        pAVar18 = local_48;
        subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
        subpassDesc.colorAttachmentCount = 0;
        subpassDesc._28_4_ = 0;
        subpassDesc.flags = (undefined4)attachments[0].m_internal;
        subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
        subpassDesc._8_8_ = attachments[1].m_internal;
        attachments[0].m_internal = 0;
        attachments[1].m_internal = 0;
        VVar6.m_internal =
             (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
        if (VVar6.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      deleter,VVar6);
        }
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (attachments[0].m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                     (VkImage)attachments[0].m_internal);
        }
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&subpassDesc,vk,device,
                   (VkImage)(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal);
        (*pAVar18->_vptr_Allocator[3])(attachments,pAVar18,&subpassDesc,0);
        VVar9 = attachments[0];
        attachments[0].m_internal = 0;
        pAVar7 = (this->m_resolvedImageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        if (pAVar7 != (Allocation *)VVar9.m_internal) {
          if (pAVar7 != (Allocation *)0x0) {
            (*pAVar7->_vptr_Allocation[1])();
            (this->m_resolvedImageMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
                 (Allocation *)0x0;
          }
          (this->m_resolvedImageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)VVar9.m_internal;
        }
        if (attachments[0].m_internal != 0) {
          (**(code **)(*(long *)attachments[0].m_internal + 8))();
          attachments[0].m_internal = 0;
        }
        VVar16 = (*vk->_vptr_DeviceInterface[0xd])
                           (vk,device,
                            (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,
                            (((this->m_resolvedImageMemory).
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.ptr)->m_memory).m_internal);
        ::vk::checkResult(VVar16,
                          "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                          ,0x21e);
        imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        imageCreateInfo.pNext._0_4_ = 0;
        imageCreateInfo.pNext._4_4_ = 0;
        imageCreateInfo.flags = 0;
        dVar8 = (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                m_internal;
        imageCreateInfo.format = (VkFormat)dVar8;
        imageCreateInfo.extent.width = (deUint32)(dVar8 >> 0x20);
        imageCreateInfo.extent.height = 1;
        imageCreateInfo.extent.depth = this->m_imageFormat;
        imageCreateInfo.mipLevels = 3;
        imageCreateInfo.arrayLayers = 4;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = 6;
        imageCreateInfo.usage = 1;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.queueFamilyIndexCount = 1;
        imageCreateInfo._68_4_ = 0;
        imageCreateInfo.pQueueFamilyIndices =
             (deUint32 *)CONCAT44(imageCreateInfo.pQueueFamilyIndices._4_4_,1);
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                   (VkImageViewCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
        subpassDesc._24_8_ = properties.maxResourceSize;
        subpassDesc.flags = properties.maxExtent.width;
        subpassDesc.pipelineBindPoint = properties.maxExtent.height;
        subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
        subpassDesc._12_4_ = properties.maxMipLevels;
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
        properties.maxExtent.depth = 0;
        properties.maxMipLevels = 0;
        properties.maxArrayLayers = 0;
        properties.sampleCounts = 0;
        properties.maxResourceSize = 0;
        VVar9.m_internal =
             (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        if (VVar9.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&(this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                      m_data.deleter,VVar9);
        }
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                     (VkImageView)properties.maxExtent._0_8_);
        }
      }
      imageCreateInfo.mipLevels = this->m_imageFormat;
      imageCreateInfo._0_8_ = (ulong)imageCreateInfo.mipLevels << 0x20;
      imageCreateInfo.pNext._0_4_ = this->m_sampleCount;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.imageType = VK_IMAGE_TYPE_3D;
      imageCreateInfo.format = VK_FORMAT_R4G4_UNORM_PACK8;
      imageCreateInfo.extent.width = 2;
      imageCreateInfo.extent.height = 2;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.arrayLayers = 1;
      imageCreateInfo.samples = VK_SAMPLE_COUNT_2_BIT;
      imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
      imageCreateInfo.usage = 2;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
      imageCreateInfo.queueFamilyIndexCount = 2;
      imageCreateInfo._68_4_ = 2;
      subpassDesc.pColorAttachments = &attachmentRef;
      attachmentRef.attachment = 0;
      attachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      resolveAttachmentRef.attachment = 1;
      resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc._8_8_ = subpassDesc._8_8_ & 0xffffffff00000000;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 1;
      bVar22 = this->m_multisampling != 0;
      subpassDesc.pResolveAttachments = &resolveAttachmentRef;
      if (!bVar22) {
        subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
      }
      subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
      subpassDesc.preserveAttachmentCount = 0;
      subpassDesc.pPreserveAttachments = (deUint32 *)0x0;
      properties.maxExtent.width = 0x26;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties._16_8_ = (ulong)(bVar22 + 1) << 0x20;
      properties.maxResourceSize = (VkDeviceSize)&imageCreateInfo;
      ::vk::createRenderPass
                (&local_68,vk,device,(VkRenderPassCreateInfo *)&properties,
                 (VkAllocationCallbacks *)0x0);
      pVVar14 = local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
      pVVar13 = local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
      attachments[0].m_internal =
           local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
      attachments[1].m_internal =
           (deUint64)
           local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj_00.m_internal =
           (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
           m_internal;
      if (obj_00.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                    deleter,obj_00);
      }
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           pVVar13;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = pVVar14;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
           attachments[0].m_internal;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)attachments[1].m_internal;
      if (local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                   (VkRenderPass)
                   local_68.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal)
        ;
      }
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.format = VK_FORMAT_R8_SSCALED;
      imageCreateInfo.extent.width = 0;
      imageCreateInfo.extent.height = 0x40;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar10.m_internal =
           (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar10.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data
                    .deleter,VVar10);
      }
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_device = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                   (VkBuffer)properties.maxExtent._0_8_);
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar18->_vptr_Allocator[3])(&properties,pAVar18,&subpassDesc,1);
      uVar12 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar7 = (this->m_vertexIndexBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar7 != (Allocation *)uVar12) {
        if (pAVar7 != (Allocation *)0x0) {
          (*pAVar7->_vptr_Allocation[1])();
          (this->m_vertexIndexBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_vertexIndexBufferMemory).
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)uVar12;
      }
      if (properties.maxExtent._0_8_ != 0) {
        (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
      }
      pAVar7 = (this->m_vertexIndexBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar16 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.object.m_internal,(pAVar7->m_memory).m_internal,pAVar7->m_offset);
      ::vk::checkResult(VVar16,
                        "vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x291);
      puVar11 = (undefined8 *)
                ((this->m_vertexIndexBufferMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
                m_hostPtr;
      *puVar11 = 0x2000200010000;
      *(undefined4 *)(puVar11 + 1) = 0x30001;
      pAVar7 = (this->m_vertexIndexBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      ::vk::flushMappedMemoryRange
                (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,
                 0xffffffffffffffff);
      attachments[0].m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      attachments[1].m_internal =
           (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      dVar8 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
      imageCreateInfo.format = (VkFormat)dVar8;
      imageCreateInfo.extent.width = (deUint32)(dVar8 >> 0x20);
      imageCreateInfo.extent.height = 2 - (this->m_multisampling == 0);
      imageCreateInfo._40_8_ = attachments;
      imageCreateInfo.samples = this->m_renderWidth;
      imageCreateInfo.tiling = this->m_renderHeight;
      imageCreateInfo.usage = 1;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                 (VkFramebufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      obj_01.m_internal =
           (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
           m_internal;
      if (obj_01.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                    deleter,obj_01);
      }
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
           = subpassDesc._0_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&properties.maxExtent.depth,
                   (VkFramebuffer)properties.maxExtent._0_8_);
      }
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.format = (VkFormat)this->m_uniformBufferSize;
      imageCreateInfo.extent.width = (deUint32)(this->m_uniformBufferSize >> 0x20);
      imageCreateInfo.extent.height = 0x10;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar10.m_internal =
           (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar10.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar10);
      }
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
           = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                   (VkBuffer)properties.maxExtent._0_8_);
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar18->_vptr_Allocator[3])(&properties,pAVar18,&subpassDesc,1);
      uVar12 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar7 = (this->m_uniformBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar7 != (Allocation *)uVar12) {
        if (pAVar7 != (Allocation *)0x0) {
          (*pAVar7->_vptr_Allocation[1])();
          (this->m_uniformBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_uniformBufferMemory).
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)uVar12;
      }
      if (properties.maxExtent._0_8_ != 0) {
        (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
      }
      pAVar7 = (this->m_uniformBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar16 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.object.m_internal,(pAVar7->m_memory).m_internal,pAVar7->m_offset);
      ::vk::checkResult(VVar16,
                        "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x2c1);
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&properties);
      ::vk::DescriptorPoolBuilder::addType
                ((DescriptorPoolBuilder *)&properties,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::addType
                ((DescriptorPoolBuilder *)&properties,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc,
                 (DescriptorPoolBuilder *)&properties,vk,device,1,2);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_02.m_internal =
           (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
           m_internal;
      if (obj_02.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    deleter,obj_02);
      }
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
      m_internal = imageCreateInfo._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc.inputAttachmentCount,
                   (VkDescriptorPool)subpassDesc._0_8_);
      }
      if (properties.maxExtent._0_8_ != 0) {
        operator_delete((void *)properties.maxExtent._0_8_,
                        properties._16_8_ - properties.maxExtent._0_8_);
      }
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc,vk,device,0,
                        (VkAllocationCallbacks *)0x0);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_03.m_internal =
           (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
      if (obj_03.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                   obj_03);
      }
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
           (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
           imageCreateInfo._0_8_;
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc.inputAttachmentCount,
                   (VkFence)subpassDesc._0_8_);
      }
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.format = (VkFormat)this->m_resultBufferSize;
      imageCreateInfo.extent.width = (deUint32)(this->m_resultBufferSize >> 0x20);
      imageCreateInfo.extent.height = 2;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar10.m_internal =
           (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar10.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar10);
      }
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                   (VkBuffer)properties.maxExtent._0_8_);
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar18->_vptr_Allocator[3])(&properties,pAVar18,&subpassDesc,1);
      uVar12 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar7 = (this->m_resultBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar7 != (Allocation *)uVar12) {
        if (pAVar7 != (Allocation *)0x0) {
          (*pAVar7->_vptr_Allocation[1])();
          (this->m_resultBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_resultBufferMemory).
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)uVar12;
      }
      if (properties.maxExtent._0_8_ != 0) {
        (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
      }
      pAVar7 = (this->m_resultBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar16 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.object.m_internal,(pAVar7->m_memory).m_internal,pAVar7->m_offset);
      ::vk::checkResult(VVar16,
                        "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x2e1);
      clearImage(this,(VkImage)(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                               object.m_internal);
      if (this->m_multisampling != 0) {
        clearImage(this,(VkImage)(this->m_resolvedImage).
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
      }
      return;
    }
    pNVar21 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar21,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1c4);
  }
  __cxa_throw(pNVar21,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureRenderer::TextureRenderer (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderWidth, deUint32 renderHeight)
	: m_context					(context)
	, m_log						(context.getTestContext().getLog())
	, m_renderWidth				(renderWidth)
	, m_renderHeight			(renderHeight)
	, m_sampleCount				(sampleCount)
	, m_multisampling			(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat				(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat			(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize		(sizeof(ShaderParameters))
	, m_resultBufferSize		(renderWidth * renderHeight * m_textureFormat.getPixelSize())
	, m_viewportOffsetX			(0.0f)
	, m_viewportOffsetY			(0.0f)
	, m_viewportWidth			((float)renderWidth)
	, m_viewportHeight			((float)renderHeight)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}
	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_LOAD,												// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// Vertex index buffer
	{
		const VkBufferCreateInfo			indexBufferParams		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			s_vertexIndexBufferSize,					// VkDeviceSize			size;
			VK_BUFFER_USAGE_INDEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_vertexIndexBuffer			= createBuffer(vkd, vkDevice, &indexBufferParams);
		m_vertexIndexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_vertexIndexBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset()));

		// Load vertices into vertex buffer
		deMemcpy(m_vertexIndexBufferMemory->getHostPtr(), s_vertexIndices, s_vertexIndexBufferSize);
		flushMappedMemoryRange(vkd, vkDevice, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset(), VK_WHOLE_SIZE);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView,
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderWidth,								// deUint32					width;
			m_renderHeight,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// DescriptorPool
	{
		DescriptorPoolBuilder					descriptorPoolBuilder;

		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 2u);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	clearImage(*m_image);
	if(m_multisampling)
		clearImage(*m_resolvedImage);
}